

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer-backend-egl.c
# Opt level: O0

wpe_renderer_backend_egl_target * wpe_renderer_backend_egl_target_create(int host_fd)

{
  wpe_renderer_backend_egl_target_interface *pwVar1;
  void *pvVar2;
  wpe_renderer_backend_egl_target *target;
  wpe_renderer_backend_egl_target *pwStack_10;
  int host_fd_local;
  
  pwStack_10 = (wpe_renderer_backend_egl_target *)
               wpe_calloc_impl(1,0x20,
                               "/workspace/llm4binary/github/license_c_cmakelists/WebPlatformForEmbedded[P]libwpe/src/renderer-backend-egl.c"
                               ,0x4b);
  pwVar1 = (wpe_renderer_backend_egl_target_interface *)
           wpe_load_object("_wpe_renderer_backend_egl_target_interface");
  (pwStack_10->base).interface = pwVar1;
  if ((pwStack_10->base).interface == (wpe_renderer_backend_egl_target_interface *)0x0) {
    free(pwStack_10);
    pwStack_10 = (wpe_renderer_backend_egl_target *)0x0;
  }
  else {
    pvVar2 = (*((pwStack_10->base).interface)->create)(pwStack_10,host_fd);
    (pwStack_10->base).interface_data = pvVar2;
  }
  return pwStack_10;
}

Assistant:

struct wpe_renderer_backend_egl_target*
wpe_renderer_backend_egl_target_create(int host_fd)
{
    struct wpe_renderer_backend_egl_target* target = wpe_calloc(1, sizeof(struct wpe_renderer_backend_egl_target));

    target->base.interface = wpe_load_object("_wpe_renderer_backend_egl_target_interface");
    if (!target->base.interface) {
        wpe_free(target);
        return 0;
    }

    target->base.interface_data = target->base.interface->create(target, host_fd);

    return target;
}